

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void __thiscall QUnifiedTimer::installAnimationDriver(QUnifiedTimer *this,QAnimationDriver *d)

{
  char cVar1;
  QUnifiedTimer QVar2;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(QUnifiedTimer **)(this + 0x10) == this + 0x18) {
    cVar1 = *(char *)(*(long *)(*(QUnifiedTimer **)(this + 0x10) + 8) + 0x88);
    if (cVar1 == '\x01') {
      stopAnimationDriver(this);
    }
    *(QAnimationDriver **)(this + 0x10) = d;
    if (d != (QAnimationDriver *)0x0) {
      QObject::property((QVariant *)&local_48,&d->super_QObject,"allowNegativeDelta");
      QVar2 = (QUnifiedTimer)::QVariant::toBool((QVariant *)&local_48);
      this[0x66] = QVar2;
      ::QVariant::~QVariant((QVariant *)&local_48);
    }
    if (cVar1 != '\0') {
      startAnimationDriver(this);
    }
  }
  else {
    local_48._0_4_ = 2;
    local_48._20_4_ = 0;
    local_48._4_8_ = 0;
    local_48._12_8_ = 0;
    local_30 = "default";
    QMessageLogger::warning
              ((QMessageLogger *)&local_48,"QUnifiedTimer: animation driver already installed...");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnifiedTimer::installAnimationDriver(QAnimationDriver *d)
{
    if (driver != &defaultDriver) {
        qWarning("QUnifiedTimer: animation driver already installed...");
        return;
    }

    bool running = driver->isRunning();
    if (running)
        stopAnimationDriver();
    driver = d;
    if (driver)
        allowNegativeDelta = driver->property("allowNegativeDelta").toBool();
    if (running)
        startAnimationDriver();
}